

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

ssize_t ssl_cf_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t len,_Bool eos,CURLcode *err)

{
  undefined8 uVar1;
  ssize_t sVar2;
  ssize_t nwritten;
  cf_call_data save;
  CURLcode *err_local;
  _Bool eos_local;
  size_t len_local;
  void *buf_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  uVar1 = *(undefined8 *)((long)cf->ctx + 0x38);
  *(Curl_easy **)((long)cf->ctx + 0x38) = data;
  *err = CURLE_OK;
  sVar2 = (*Curl_ssl->send_plain)(cf,data,buf,len,err);
  *(undefined8 *)((long)cf->ctx + 0x38) = uVar1;
  return sVar2;
}

Assistant:

static ssize_t ssl_cf_send(struct Curl_cfilter *cf,
                           struct Curl_easy *data, const void *buf, size_t len,
                           bool eos, CURLcode *err)
{
  struct cf_call_data save;
  ssize_t nwritten;

  (void)eos; /* unused */
  CF_DATA_SAVE(save, cf, data);
  *err = CURLE_OK;
  nwritten = Curl_ssl->send_plain(cf, data, buf, len, err);
  CF_DATA_RESTORE(cf, save);
  return nwritten;
}